

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

int stb_vorbis_decode_frame_pushdata
              (stb_vorbis *f,uint8 *data,int data_len,int *channels,float ***output,int *samples)

{
  uint8 (*pauVar1) [4];
  CRCscan *pCVar2;
  CRCscan *pCVar3;
  byte bVar4;
  STBVorbisError SVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  uint32 uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint8 *puVar13;
  ulong uVar14;
  int iVar15;
  uint8 *puVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  int local_68;
  int left;
  int right;
  int local_44 [5];
  
  if (f->push_mode == '\0') {
    f->error = VORBIS_invalid_api_mixing;
  }
  else {
    if (-1 < f->page_crc_tests) {
      *samples = 0;
      uVar10 = f->page_crc_tests;
      lVar6 = 0;
      uVar8 = 0;
      if (0 < (int)uVar10) {
        uVar8 = (ulong)uVar10;
      }
      for (; uVar8 * 0x14 - lVar6 != 0; lVar6 = lVar6 + 0x14) {
        *(undefined4 *)((long)&f->scan[0].bytes_done + lVar6) = 0;
      }
      if ((int)uVar10 < 4) {
        if (data_len < 4) {
          return 0;
        }
        uVar17 = data_len - 3;
        puVar13 = data + 0x1b;
        puVar16 = data;
        for (uVar8 = 0; data_len = uVar17, uVar8 != uVar17; uVar8 = uVar8 + 1) {
          if ((data[uVar8] == 'O') &&
             (pauVar1 = (uint8 (*) [4])(data + uVar8), *pauVar1 == ogg_page_header)) {
            iVar7 = (int)(uVar8 + 0x1a);
            data_len = (int)uVar8;
            if ((int)uVar17 <= iVar7) break;
            bVar4 = data[uVar8 + 0x1a];
            if ((int)uVar17 <= (int)(data_len + 0x1bU + (uint)bVar4)) break;
            iVar15 = bVar4 + 0x1b;
            for (uVar14 = 0; bVar4 != uVar14; uVar14 = uVar14 + 1) {
              iVar15 = iVar15 + (uint)puVar13[uVar14];
            }
            uVar18 = 0;
            for (lVar6 = -0x16; lVar6 != 0; lVar6 = lVar6 + 1) {
              uVar18 = uVar18 << 8 ^ crc_table[uVar18 >> 0x18 ^ (uint)puVar16[lVar6 + 0x16]];
            }
            iVar11 = 4;
            while (bVar19 = iVar11 != 0, iVar11 = iVar11 + -1, bVar19) {
              uVar18 = uVar18 << 8 ^ crc_table[uVar18 >> 0x18];
            }
            uVar12 = uVar10 + 1;
            f->page_crc_tests = uVar12;
            f->scan[(int)uVar10].bytes_left = iVar15 + -0x1a;
            f->scan[(int)uVar10].crc_so_far = uVar18;
            f->scan[(int)uVar10].goal_crc = *(uint32 *)(pauVar1[5] + 2);
            uVar9 = 0xffffffff;
            if (data[(ulong)data[uVar8 + 0x1a] + uVar8 + 0x1a] != 0xff) {
              uVar9 = *(uint32 *)(pauVar1[1] + 2);
            }
            f->scan[(int)uVar10].sample_loc = uVar9;
            f->scan[(int)uVar10].bytes_done = iVar7;
            uVar10 = uVar12;
            if (uVar12 == 4) {
              uVar10 = 4;
              data_len = uVar17;
              break;
            }
          }
          puVar13 = puVar13 + 1;
          puVar16 = puVar16 + 1;
        }
      }
      iVar7 = 0;
      while( true ) {
        while( true ) {
          if ((int)uVar10 <= iVar7) {
            return data_len;
          }
          pCVar2 = f->scan + iVar7;
          iVar15 = f->scan[iVar7].bytes_done;
          uVar17 = f->scan[iVar7].bytes_left;
          uVar12 = data_len - iVar15;
          uVar18 = uVar12;
          if ((int)uVar17 < (int)uVar12) {
            uVar18 = uVar17;
          }
          uVar8 = 0;
          if (0 < (int)uVar18) {
            uVar8 = (ulong)uVar18;
          }
          uVar9 = f->scan[iVar7].crc_so_far;
          for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
            uVar9 = uVar9 << 8 ^ crc_table[uVar9 >> 0x18 ^ (uint)data[uVar14 + (long)iVar15]];
          }
          pCVar2->bytes_left = uVar17 - uVar18;
          pCVar2->crc_so_far = uVar9;
          if ((int)uVar17 <= (int)uVar12) break;
          iVar7 = iVar7 + 1;
        }
        if (uVar9 == pCVar2->goal_crc) break;
        iVar15 = uVar10 - 1;
        f->page_crc_tests = iVar15;
        pCVar2->sample_loc = f->scan[iVar15].sample_loc;
        pCVar3 = f->scan + iVar15;
        iVar15 = pCVar3->bytes_left;
        uVar9 = pCVar3->crc_so_far;
        iVar11 = pCVar3->bytes_done;
        pCVar2->goal_crc = pCVar3->goal_crc;
        pCVar2->bytes_left = iVar15;
        pCVar2->crc_so_far = uVar9;
        pCVar2->bytes_done = iVar11;
        uVar10 = f->page_crc_tests;
      }
      f->page_crc_tests = -1;
      f->previous_length = 0;
      f->next_seg = -1;
      uVar9 = pCVar2->sample_loc;
      f->current_loc = uVar9;
      f->current_loc_valid = (uint)(uVar9 != 0xffffffff);
      return uVar18 + iVar15;
    }
    f->stream = data;
    f->stream_end = data + data_len;
    f->error = VORBIS__no_error;
    iVar7 = is_whole_packet_present(f);
    if (iVar7 != 0) {
      iVar7 = vorbis_decode_packet(f,local_44,&left,&right);
      if (iVar7 == 0) {
        SVar5 = f->error;
        if (SVar5 == VORBIS_continued_packet_flag_invalid) {
          if (f->previous_length != 0) goto LAB_00168c95;
          f->error = VORBIS__no_error;
          do {
            iVar7 = get8_packet(f);
            if (iVar7 == -1) break;
          } while (f->eof == 0);
        }
        else {
          if (SVar5 != VORBIS_bad_packet_type) {
LAB_00168c95:
            stb_vorbis_flush_pushdata(f);
            f->error = SVar5;
            *samples = 0;
            return 1;
          }
          f->error = VORBIS__no_error;
          do {
            iVar7 = get8_packet(f);
            if (iVar7 == -1) break;
          } while (f->eof == 0);
        }
        *samples = 0;
        iVar7 = *(int *)&f->stream;
      }
      else {
        iVar7 = vorbis_finish_frame(f,local_44[0],left,right);
        uVar10 = f->channels;
        uVar8 = 0;
        uVar14 = 0;
        if (0 < (int)uVar10) {
          uVar14 = (ulong)uVar10;
        }
        for (; uVar14 != uVar8; uVar8 = uVar8 + 1) {
          f->outputs[uVar8] = f->channel_buffers[uVar8] + left;
        }
        if (channels != (int *)0x0) {
          *channels = uVar10;
        }
        *samples = iVar7;
        *output = f->outputs;
        iVar7 = *(int *)&f->stream;
      }
      local_68 = (int)data;
      return iVar7 - local_68;
    }
    *samples = 0;
  }
  return 0;
}

Assistant:

int stb_vorbis_decode_frame_pushdata(
         stb_vorbis *f,                   // the file we're decoding
         const uint8 *data, int data_len, // the memory available for decoding
         int *channels,                   // place to write number of float * buffers
         float ***output,                 // place to write float ** array of float * buffers
         int *samples                     // place to write number of output samples
     )
{
   int i;
   int len,right,left;

   if (!IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   if (f->page_crc_tests >= 0) {
      *samples = 0;
      return vorbis_search_for_page_pushdata(f, (uint8 *) data, data_len);
   }

   f->stream     = (uint8 *) data;
   f->stream_end = (uint8 *) data + data_len;
   f->error      = VORBIS__no_error;

   // check that we have the entire packet in memory
   if (!is_whole_packet_present(f)) {
      *samples = 0;
      return 0;
   }

   if (!vorbis_decode_packet(f, &len, &left, &right)) {
      // save the actual error we encountered
      enum STBVorbisError error = f->error;
      if (error == VORBIS_bad_packet_type) {
         // flush and resynch
         f->error = VORBIS__no_error;
         while (get8_packet(f) != EOP)
            if (f->eof) break;
         *samples = 0;
         return (int) (f->stream - data);
      }
      if (error == VORBIS_continued_packet_flag_invalid) {
         if (f->previous_length == 0) {
            // we may be resynching, in which case it's ok to hit one
            // of these; just discard the packet
            f->error = VORBIS__no_error;
            while (get8_packet(f) != EOP)
               if (f->eof) break;
            *samples = 0;
            return (int) (f->stream - data);
         }
      }
      // if we get an error while parsing, what to do?
      // well, it DEFINITELY won't work to continue from where we are!
      stb_vorbis_flush_pushdata(f);
      // restore the error that actually made us bail
      f->error = error;
      *samples = 0;
      return 1;
   }

   // success!
   len = vorbis_finish_frame(f, len, left, right);
   for (i=0; i < f->channels; ++i)
      f->outputs[i] = f->channel_buffers[i] + left;

   if (channels) *channels = f->channels;
   *samples = len;
   *output = f->outputs;
   return (int) (f->stream - data);
}